

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O2

UNewTrie *
utrie_clone_63(UNewTrie *fillIn,UNewTrie *other,uint32_t *aliasData,int32_t aliasDataCapacity)

{
  int iVar1;
  uint32_t *puVar2;
  UNewTrie *__dest;
  UBool UVar3;
  
  if (((other != (UNewTrie *)0x0) && (puVar2 = other->data, puVar2 != (uint32_t *)0x0)) &&
     (other->isCompacted == '\0')) {
    iVar1 = other->dataCapacity;
    if (aliasDataCapacity < iVar1 || aliasData == (uint32_t *)0x0) {
      aliasData = (uint32_t *)uprv_malloc_63((long)iVar1 << 2);
      if (aliasData == (uint32_t *)0x0) {
        return (UNewTrie *)0x0;
      }
      puVar2 = other->data;
      UVar3 = '\x01';
      aliasDataCapacity = iVar1;
    }
    else {
      UVar3 = '\0';
    }
    __dest = utrie_open_63(fillIn,aliasData,aliasDataCapacity,*puVar2,other->leadUnitValue,
                           other->isLatin1Linear);
    if (__dest != (UNewTrie *)0x0) {
      memcpy(__dest,other,0x22080);
      memcpy(__dest->data,other->data,(long)other->dataLength << 2);
      __dest->dataLength = other->dataLength;
      __dest->isDataAllocated = UVar3;
      return __dest;
    }
    uprv_free_63(aliasData);
  }
  return (UNewTrie *)0x0;
}

Assistant:

U_CAPI UNewTrie * U_EXPORT2
utrie_clone(UNewTrie *fillIn, const UNewTrie *other, uint32_t *aliasData, int32_t aliasDataCapacity) {
    UNewTrie *trie;
    UBool isDataAllocated;

    /* do not clone if other is not valid or already compacted */
    if(other==NULL || other->data==NULL || other->isCompacted) {
        return NULL;
    }

    /* clone data */
    if(aliasData!=NULL && aliasDataCapacity>=other->dataCapacity) {
        isDataAllocated=FALSE;
    } else {
        aliasDataCapacity=other->dataCapacity;
        aliasData=(uint32_t *)uprv_malloc(other->dataCapacity*4);
        if(aliasData==NULL) {
            return NULL;
        }
        isDataAllocated=TRUE;
    }

    trie=utrie_open(fillIn, aliasData, aliasDataCapacity,
                    other->data[0], other->leadUnitValue,
                    other->isLatin1Linear);
    if(trie==NULL) {
        uprv_free(aliasData);
    } else {
        uprv_memcpy(trie->index, other->index, sizeof(trie->index));
        uprv_memcpy(trie->data, other->data, (size_t)other->dataLength*4);
        trie->dataLength=other->dataLength;
        trie->isDataAllocated=isDataAllocated;
    }

    return trie;
}